

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rematch.cpp
# Opt level: O2

UBool __thiscall icu_63::RegexMatcher::isChunkWordBoundary(RegexMatcher *this,int32_t pos)

{
  UChar *pUVar1;
  byte bVar2;
  UBool UVar3;
  int8_t iVar4;
  byte bVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  
  pUVar1 = this->fInputText->chunkContents;
  lVar8 = (long)pos;
  if (this->fLookLimit <= lVar8) {
    this->fHitEnd = '\x01';
    bVar5 = 0;
    goto LAB_00168591;
  }
  uVar9 = (uint)(ushort)pUVar1[lVar8];
  if ((uVar9 & 0xf800) == 0xd800) {
    if (((ushort)pUVar1[lVar8] >> 10 & 1) == 0) {
      if ((this->fLookLimit != (long)(pos + 1)) &&
         (uVar7 = (uint)(ushort)pUVar1[pos + 1], (pUVar1[pos + 1] & 0xfc00U) == 0xdc00)) {
        uVar9 = uVar9 << 10;
LAB_0016864a:
        uVar9 = uVar9 + uVar7 + 0xfca02400;
      }
    }
    else if ((this->fLookStart < lVar8) && ((pUVar1[lVar8 + -1] & 0xfc00U) == 0xd800)) {
      uVar7 = (uint)(ushort)pUVar1[lVar8 + -1] << 10;
      goto LAB_0016864a;
    }
  }
  UVar3 = u_hasBinaryProperty_63(uVar9,UCHAR_GRAPHEME_EXTEND);
  if ((UVar3 != '\0') || (iVar4 = u_charType_63(uVar9), iVar4 == '\x10')) {
    return '\0';
  }
  bVar5 = UnicodeSet::contains(this->fPattern->fStaticSets[1],uVar9);
LAB_00168591:
  do {
    lVar8 = (long)pos;
    if (lVar8 <= this->fLookStart) {
      bVar2 = 0;
      goto LAB_00168626;
    }
    iVar6 = pos + -1;
    uVar9 = (uint)(ushort)pUVar1[lVar8 + -1];
    if (((this->fLookStart < lVar8 + -1) && ((uVar9 & 0xfc00) == 0xdc00)) &&
       ((pUVar1[lVar8 + -2] & 0xfc00U) == 0xd800)) {
      uVar9 = (uint)(ushort)pUVar1[lVar8 + -1] + (uint)(ushort)pUVar1[lVar8 + -2] * 0x400 +
              0xfca02400;
      iVar6 = pos + -2;
    }
    pos = iVar6;
    UVar3 = u_hasBinaryProperty_63(uVar9,UCHAR_GRAPHEME_EXTEND);
  } while ((UVar3 != '\0') || (iVar4 = u_charType_63(uVar9), iVar4 == '\x10'));
  bVar2 = UnicodeSet::contains(this->fPattern->fStaticSets[1],uVar9);
LAB_00168626:
  return bVar2 ^ bVar5;
}

Assistant:

UBool RegexMatcher::isChunkWordBoundary(int32_t pos) {
    UBool isBoundary = FALSE;
    UBool cIsWord    = FALSE;

    const UChar *inputBuf = fInputText->chunkContents;

    if (pos >= fLookLimit) {
        fHitEnd = TRUE;
    } else {
        // Determine whether char c at current position is a member of the word set of chars.
        // If we're off the end of the string, behave as though we're not at a word char.
        UChar32 c;
        U16_GET(inputBuf, fLookStart, pos, fLookLimit, c);
        if (u_hasBinaryProperty(c, UCHAR_GRAPHEME_EXTEND) || u_charType(c) == U_FORMAT_CHAR) {
            // Current char is a combining one.  Not a boundary.
            return FALSE;
        }
        cIsWord = fPattern->fStaticSets[URX_ISWORD_SET]->contains(c);
    }

    // Back up until we come to a non-combining char, determine whether
    //  that char is a word char.
    UBool prevCIsWord = FALSE;
    for (;;) {
        if (pos <= fLookStart) {
            break;
        }
        UChar32 prevChar;
        U16_PREV(inputBuf, fLookStart, pos, prevChar);
        if (!(u_hasBinaryProperty(prevChar, UCHAR_GRAPHEME_EXTEND)
              || u_charType(prevChar) == U_FORMAT_CHAR)) {
            prevCIsWord = fPattern->fStaticSets[URX_ISWORD_SET]->contains(prevChar);
            break;
        }
    }
    isBoundary = cIsWord ^ prevCIsWord;
    return isBoundary;
}